

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_channel_converter_process_pcm_frames__passthrough
                    (ma_channel_converter *pConverter,void *pFramesOut,void *pFramesIn,
                    ma_uint64 frameCount)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  ma_uint64 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_channel_converter *pConverter_local;
  
  if (pConverter == (ma_channel_converter *)0x0) {
    __assert_fail("pConverter != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x8570,
                  "ma_result ma_channel_converter_process_pcm_frames__passthrough(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pFramesOut != (void *)0x0) {
    if (pFramesIn != (void *)0x0) {
      mVar1 = pConverter->channelsOut;
      mVar2 = ma_get_bytes_per_sample(pConverter->format);
      memcpy(pFramesOut,pFramesIn,frameCount * (mVar2 * mVar1));
      return 0;
    }
    __assert_fail("pFramesIn != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x8572,
                  "ma_result ma_channel_converter_process_pcm_frames__passthrough(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  __assert_fail("pFramesOut != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x8571,
                "ma_result ma_channel_converter_process_pcm_frames__passthrough(ma_channel_converter *, void *, const void *, ma_uint64)"
               );
}

Assistant:

static ma_result ma_channel_converter_process_pcm_frames__passthrough(ma_channel_converter* pConverter, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    MA_ASSERT(pConverter != NULL);
    MA_ASSERT(pFramesOut != NULL);
    MA_ASSERT(pFramesIn  != NULL);

    ma_copy_memory_64(pFramesOut, pFramesIn, frameCount * ma_get_bytes_per_frame(pConverter->format, pConverter->channelsOut));
    return MA_SUCCESS;
}